

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O2

bool __thiscall QToolBar::event(QToolBar *this,QEvent *event)

{
  ushort uVar1;
  long lVar2;
  QToolBarPrivate *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  char cVar8;
  bool bVar9;
  bool bVar10;
  QStyle *pQVar11;
  QWidget *pQVar12;
  long in_FS_OFFSET;
  QPointF QVar13;
  QPointF local_b0;
  QPoint local_a0;
  undefined1 local_98 [16];
  QStyleOptionToolBar opt;
  
  auVar7._8_8_ = local_98._8_8_;
  auVar7._0_8_ = local_98._0_8_;
  auVar6._8_8_ = local_98._8_8_;
  auVar6._0_8_ = local_98._0_8_;
  auVar5._8_8_ = local_98._8_8_;
  auVar5._0_8_ = local_98._0_8_;
  auVar4._8_8_ = local_98._8_8_;
  auVar4._0_8_ = local_98._0_8_;
  auVar3._8_8_ = local_98._8_8_;
  auVar3._0_8_ = local_98._0_8_;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QToolBarPrivate **)&(this->super_QWidget).field_0x8;
  uVar1 = *(ushort *)(event + 8);
  bVar10 = true;
  switch(uVar1) {
  case 1:
    local_98 = auVar7;
    if ((this_00->waitForPopupTimer).m_id == *(TimerId *)(event + 0x10)) {
      pQVar12 = QApplication::activePopupWidget();
      bVar10 = waitForPopup(this,pQVar12);
      if (!bVar10) {
        QBasicTimer::stop();
        if ((((this->super_QWidget).data)->widget_attributes & 2) == 0) goto LAB_0046d191;
      }
    }
    break;
  case 2:
    bVar9 = QToolBarPrivate::mousePressEvent(this_00,(QMouseEvent *)event);
    goto LAB_0046d0d7;
  case 3:
    bVar9 = QToolBarPrivate::mouseReleaseEvent(this_00,(QMouseEvent *)event);
    goto LAB_0046d0d7;
  case 4:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
    break;
  case 5:
    bVar9 = QToolBarPrivate::mouseMoveEvent(this_00,(QMouseEvent *)event);
LAB_0046d0d7:
    if (bVar9 != false) goto LAB_0046d1ac;
    break;
  case 0xb:
    if (((this_00->state == (DragState *)0x0) ||
        (local_98 = auVar5, this_00->state->dragging == false)) &&
       (local_98 = auVar6, (this_00->layout->super_QLayout).super_QLayoutItem.field_0xc == '\x01'))
    {
      pQVar12 = QApplication::activePopupWidget();
      bVar10 = waitForPopup(this,pQVar12);
      if (bVar10) {
        QBasicTimer::start(&this_00->waitForPopupTimer,(Duration)0x1dcd6500,(QObject *)this);
      }
      else {
        QBasicTimer::stop();
LAB_0046d191:
        QToolBarLayout::setExpanded(this_00->layout,false);
      }
    }
    break;
  default:
    local_98 = auVar7;
    if (uVar1 - 0x7f < 2) goto LAB_0046d1ac;
    if (uVar1 == 0x11) {
LAB_0046d13f:
      QAction::setChecked(SUB81(this_00->toggleViewAction,0));
      visibilityChanged(this,*(short *)(event + 8) == 0x11);
    }
    else if (uVar1 == 0x12) {
      local_98 = auVar4;
      if ((((this->super_QWidget).data)->widget_attributes & 0x10000) != 0) goto LAB_0046d13f;
    }
    else if (uVar1 == 0x15) {
      QToolBarLayout::checkUsePopupMenu(this_00->layout);
    }
    else {
      local_98 = auVar3;
      if (uVar1 == 0x81) {
        opt._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
        opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
        opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QStyleOptionToolBar::QStyleOptionToolBar(&opt);
        (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,&opt);
        pQVar11 = QWidget::style(&this->super_QWidget);
        local_98 = (**(code **)(*(long *)pQVar11 + 0xc0))(pQVar11,0x34,&opt,this);
        QVar13 = QSinglePointEvent::position((QSinglePointEvent *)event);
        local_b0.yp = QVar13.yp;
        local_b0.xp = QVar13.xp;
        local_a0 = QPointF::toPoint(&local_b0);
        cVar8 = QRect::contains((QPoint *)local_98,SUB81(&local_a0,0));
        if (cVar8 == '\0') {
          QWidget::unsetCursor(&this->super_QWidget);
        }
        else {
          QCursor::QCursor((QCursor *)local_98,SizeAllCursor);
          QWidget::setCursor(&this->super_QWidget,(QCursor *)local_98);
          QCursor::~QCursor((QCursor *)local_98);
        }
        QStyleOption::~QStyleOption(&opt.super_QStyleOption);
      }
    }
  }
  bVar10 = QWidget::event(&this->super_QWidget,event);
LAB_0046d1ac:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar10;
}

Assistant:

bool QToolBar::event(QEvent *event)
{
    Q_D(QToolBar);

    switch (event->type()) {
    case QEvent::Timer:
        if (d->waitForPopupTimer.timerId() == static_cast<QTimerEvent*>(event)->timerId()) {
            QWidget *w = QApplication::activePopupWidget();
            if (!waitForPopup(this, w)) {
                d->waitForPopupTimer.stop();
                if (!this->underMouse())
                    d->layout->setExpanded(false);
            }
        }
        break;
    case QEvent::Hide:
        if (!isHidden())
            break;
        Q_FALLTHROUGH();
    case QEvent::Show:
        d->toggleViewAction->setChecked(event->type() == QEvent::Show);
#ifdef Q_OS_MACOS
        enableMacToolBar(this, event->type() == QEvent::Show);
#endif
        emit visibilityChanged(event->type() == QEvent::Show);
        break;
    case QEvent::ParentChange:
        d->layout->checkUsePopupMenu();
        break;

    case QEvent::MouseButtonPress: {
        if (d->mousePressEvent(static_cast<QMouseEvent*>(event)))
            return true;
        break;
    }
    case QEvent::MouseButtonRelease:
        if (d->mouseReleaseEvent(static_cast<QMouseEvent*>(event)))
            return true;
        break;
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
        // there's nothing special to do here and we don't want to update the whole widget
        return true;
    case QEvent::HoverMove: {
#ifndef QT_NO_CURSOR
        QHoverEvent *e = static_cast<QHoverEvent*>(event);
        QStyleOptionToolBar opt;
        initStyleOption(&opt);
        if (style()->subElementRect(QStyle::SE_ToolBarHandle, &opt, this).contains(e->position().toPoint()))
            setCursor(Qt::SizeAllCursor);
        else
            unsetCursor();
#endif
        break;
    }
    case QEvent::MouseMove:
        if (d->mouseMoveEvent(static_cast<QMouseEvent*>(event)))
            return true;
        break;
    case QEvent::Leave:
        if (d->state != nullptr && d->state->dragging) {
#ifdef Q_OS_WIN
            // This is a workaround for losing the mouse on Vista.
            QPoint pos = QCursor::pos();
            QMouseEvent fake(QEvent::MouseMove, mapFromGlobal(pos), pos, Qt::NoButton,
                             QGuiApplication::mouseButtons(), QGuiApplication::keyboardModifiers());
            d->mouseMoveEvent(&fake);
#endif
        } else {
            if (!d->layout->expanded)
                break;

            QWidget *w = QApplication::activePopupWidget();
            if (waitForPopup(this, w)) {
                d->waitForPopupTimer.start(POPUP_TIMER_INTERVAL, this);
                break;
            }

            d->waitForPopupTimer.stop();
            d->layout->setExpanded(false);
            break;
        }
        break;
    default:
        break;
    }
    return QWidget::event(event);
}